

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void GetHostName(string *hostname)

{
  size_type __len1;
  int iVar1;
  size_t __len2;
  undefined1 local_1a6 [8];
  utsname buf;
  
  iVar1 = uname((utsname *)local_1a6);
  if (iVar1 != 0) {
    buf.sysname[0x39] = '\0';
  }
  __len1 = hostname->_M_string_length;
  __len2 = strlen(buf.sysname + 0x39);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (hostname,0,__len1,buf.sysname + 0x39,__len2);
  return;
}

Assistant:

static void GetHostName(string* hostname) {
#if defined(HAVE_SYS_UTSNAME_H)
  struct utsname buf;
  if (0 != uname(&buf)) {
    // ensure null termination on failure
    *buf.nodename = '\0';
  }
  *hostname = buf.nodename;
#elif defined(GLOG_OS_WINDOWS)
  char buf[MAX_COMPUTERNAME_LENGTH + 1];
  DWORD len = MAX_COMPUTERNAME_LENGTH + 1;
  if (GetComputerNameA(buf, &len)) {
    *hostname = buf;
  } else {
    hostname->clear();
  }
#else
# warning There is no way to retrieve the host name.
  *hostname = "(unknown)";
#endif
}